

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cc
# Opt level: O0

long sock_ctrl(BIO *b,int cmd,long num,void *ptr)

{
  int *out;
  void *ptr_local;
  long num_local;
  int cmd_local;
  BIO *b_local;
  
  if (cmd == 8) {
    b_local = (BIO *)(long)b->shutdown;
  }
  else if (cmd == 9) {
    b->shutdown = (int)num;
    b_local = (BIO *)0x1;
  }
  else if (cmd == 0xb) {
    b_local = (BIO *)0x1;
  }
  else if (cmd == 0x68) {
    sock_free(b);
    b->num = *ptr;
    b->shutdown = (int)num;
    b->init = 1;
    b_local = (BIO *)0x1;
  }
  else if (cmd == 0x69) {
    if (b->init == 0) {
      b_local = (BIO *)0xffffffffffffffff;
    }
    else {
      if (ptr != (void *)0x0) {
        *(int *)ptr = b->num;
      }
      b_local = (BIO *)(long)b->num;
    }
  }
  else {
    b_local = (BIO *)0x0;
  }
  return (long)b_local;
}

Assistant:

static long sock_ctrl(BIO *b, int cmd, long num, void *ptr) {
  switch (cmd) {
    case BIO_C_SET_FD:
      sock_free(b);
      b->num = *static_cast<int *>(ptr);
      b->shutdown = static_cast<int>(num);
      b->init = 1;
      return 1;
    case BIO_C_GET_FD:
      if (b->init) {
        int *out = static_cast<int*>(ptr);
        if (out != nullptr) {
          *out = b->num;
        }
        return b->num;
      }
      return -1;
    case BIO_CTRL_GET_CLOSE:
      return b->shutdown;
    case BIO_CTRL_SET_CLOSE:
      b->shutdown = static_cast<int>(num);
      return 1;
    case BIO_CTRL_FLUSH:
      return 1;
    default:
      return 0;
  }
}